

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint value;
  uint value_00;
  int iVar6;
  int iVar7;
  uint uVar8;
  uivector nextcode;
  uivector blcount;
  
  blcount.allocsize = 0;
  nextcode.allocsize = 0;
  blcount.data = (uint *)0x0;
  blcount.size = 0;
  nextcode.data = (uint *)0x0;
  nextcode.size = 0;
  puVar4 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar4;
  uVar3 = uivector_resizev(&blcount,(ulong)(tree->maxbitlen + 1),value);
  if (((uVar3 == 0) ||
      (uVar3 = uivector_resizev(&nextcode,(ulong)(tree->maxbitlen + 1),value_00),
      puVar4 == (uint *)0x0)) || (uVar3 == 0)) {
    uivector_cleanup(&blcount);
    uivector_cleanup(&nextcode);
  }
  else {
    for (uVar3 = 0; uVar3 != tree->numcodes; uVar3 = uVar3 + 1) {
      blcount.data[tree->lengths[uVar3]] = blcount.data[tree->lengths[uVar3]] + 1;
    }
    uVar5 = 0;
    while (uVar3 = (int)uVar5 + 1, uVar3 <= tree->maxbitlen) {
      nextcode.data[uVar3] = (blcount.data[uVar5] + nextcode.data[uVar5]) * 2;
      uVar5 = (ulong)uVar3;
    }
    for (uVar3 = 0; uVar3 != tree->numcodes; uVar3 = uVar3 + 1) {
      uVar5 = (ulong)tree->lengths[uVar3];
      if (uVar5 != 0) {
        uVar1 = nextcode.data[uVar5];
        nextcode.data[uVar5] = uVar1 + 1;
        tree->tree1d[uVar3] = uVar1;
      }
    }
    uivector_cleanup(&blcount);
    uivector_cleanup(&nextcode);
    uVar3 = tree->numcodes;
    puVar4 = (uint *)malloc((ulong)(uVar3 * 2) << 2);
    tree->tree2d = puVar4;
    if (puVar4 != (uint *)0x0) {
      for (uVar5 = 0; uVar5 < uVar3 * 2; uVar5 = uVar5 + 1) {
        tree->tree2d[uVar5] = 0x7fff;
        uVar3 = tree->numcodes;
      }
      uVar5 = 0;
      iVar6 = 0;
      iVar7 = 0;
      do {
        if (uVar3 <= uVar5) {
          for (uVar5 = 0; uVar5 < uVar3 * 2; uVar5 = uVar5 + 1) {
            if (tree->tree2d[uVar5] == 0x7fff) {
              tree->tree2d[uVar5] = 0;
              uVar3 = tree->numcodes;
            }
          }
          return 0;
        }
        uVar3 = 0;
        while (uVar1 = tree->lengths[uVar5], uVar3 != uVar1) {
          if (iVar7 < 0) {
            return 0x37;
          }
          uVar2 = tree->numcodes;
          if (uVar2 < iVar7 + 2U) {
            return 0x37;
          }
          puVar4 = tree->tree2d;
          uVar8 = (uint)((tree->tree1d[uVar5] >> (~uVar3 + uVar1 & 0x1f) & 1) != 0) + iVar7 * 2;
          if (puVar4[uVar8] == 0x7fff) {
            uVar3 = uVar3 + 1;
            if (uVar3 == uVar1) {
              puVar4[uVar8] = (uint)uVar5;
              iVar7 = 0;
              uVar3 = uVar1;
            }
            else {
              iVar7 = iVar6 + 1;
              puVar4[uVar8] = iVar6 + uVar2 + 1;
              iVar6 = iVar7;
            }
          }
          else {
            iVar7 = puVar4[uVar8] - uVar2;
            uVar3 = uVar3 + 1;
          }
        }
        uVar5 = uVar5 + 1;
        uVar3 = tree->numcodes;
      } while( true );
    }
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
	uivector blcount;
	uivector nextcode;
	unsigned error = 0;
	unsigned bits, n;

	uivector_init(&blcount);
	uivector_init(&nextcode);

	tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
	if (!tree->tree1d) error = 83; /*alloc fail*/

	if (!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
		|| !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
		error = 83; /*alloc fail*/

	if (!error)
	{
		/*step 1: count number of instances of each code length*/
		for (bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
		/*step 2: generate the nextcode values*/
		for (bits = 1; bits <= tree->maxbitlen; ++bits)
		{
			nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
		}
		/*step 3: generate all the codes*/
		for (n = 0; n != tree->numcodes; ++n)
		{
			if (tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
		}
	}

	uivector_cleanup(&blcount);
	uivector_cleanup(&nextcode);

	if (!error) return HuffmanTree_make2DTree(tree);
	else return error;
}